

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ParseSimpleStream
               (ZeroCopyInputStream *input_stream,string *stream_name,LineConsumer *line_consumer,
               string *out_error)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t size;
  StringPiece chunk;
  StringPiece chunk_00;
  int buf_len;
  string local_error;
  void *buf;
  Parser parser;
  int local_bc;
  string *local_b8;
  string *local_b0;
  string local_a8;
  char *local_88;
  Parser local_80;
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_80.leftover_._M_dataplus._M_p = (pointer)&local_80.leftover_.field_2;
  local_80.line_ = 0;
  local_80.leftover_._M_string_length = 0;
  local_80.leftover_.field_2._M_local_buf[0] = '\0';
  local_b8 = out_error;
  local_b0 = stream_name;
  local_80.line_consumer_ = line_consumer;
  do {
    do {
      iVar4 = (*input_stream->_vptr_ZeroCopyInputStream[2])(input_stream,&local_88,&local_bc);
      pcVar1 = local_88;
      if ((char)iVar4 == '\0') {
        bVar2 = true;
        if (local_80.leftover_._M_string_length == 0) goto LAB_00270ce6;
        chunk_00.length_ = 1;
        chunk_00.ptr_ = "\n";
        bVar3 = anon_unknown_0::Parser::ParseChunk(&local_80,chunk_00,&local_a8);
        if (bVar3) {
          if (local_80.leftover_._M_string_length == 0) goto LAB_00270ce6;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_a8,0,(char *)local_a8._M_string_length,0x3e7241);
        }
        anon_unknown_0::FullErrorString(&local_50,local_b0,local_80.line_,&local_a8);
        goto LAB_00270cbd;
      }
      size = (size_t)local_bc;
    } while (size == 0);
    if (local_bc < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
    }
    chunk.length_ = size;
    chunk.ptr_ = pcVar1;
    bVar2 = anon_unknown_0::Parser::ParseChunk(&local_80,chunk,&local_a8);
  } while (bVar2);
  anon_unknown_0::FullErrorString(&local_50,local_b0,local_80.line_,&local_a8);
LAB_00270cbd:
  std::__cxx11::string::operator=((string *)local_b8,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  bVar2 = false;
LAB_00270ce6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.leftover_._M_dataplus._M_p != &local_80.leftover_.field_2) {
    operator_delete(local_80.leftover_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       const std::string& stream_name,
                       LineConsumer* line_consumer,
                       std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len),
                           &local_error)) {
      *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
    return false;
  }
  return true;
}